

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::addTextToBuffer
          (DebugInfoRenderer *this,string *text,int yOffset)

{
  vector<float,std::allocator<float>> *this_00;
  int iVar1;
  int iVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  float *pfVar5;
  undefined4 in_register_00000014;
  int x;
  uint uVar6;
  long lVar7;
  unsigned_short uVar8;
  iterator iVar9;
  iterator iVar10;
  long lVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  float bx;
  float ax;
  float by;
  float ay;
  unsigned_short local_8a;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_78;
  ulong local_70;
  uint local_64;
  long local_60;
  ulong local_58;
  string *local_50;
  long local_48;
  ulong local_40;
  vector<float,std::allocator<float>> *local_38;
  
  local_70 = CONCAT44(in_register_00000014,yOffset);
  if ((addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&addTextToBuffer(std::__cxx11::string_const&,int)::
                                   charsStr_abi_cxx11_), iVar2 != 0)) {
    addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_._M_dataplus._M_p =
         (pointer)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
               "0123456789.:/","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_);
  }
  if (0 < (int)text->_M_string_length) {
    local_70 = (ulong)(uint)((int)local_70 << 3);
    local_38 = (vector<float,std::allocator<float>> *)&this->m_posBuf;
    local_78 = &this->m_ndxBuf;
    local_40 = 0;
    lVar7 = 0;
    local_50 = text;
    do {
      iVar2 = (int)local_40;
      iVar1 = std::__cxx11::string::find('@',(ulong)(uint)(int)(local_50->_M_dataplus)._M_p[lVar7]);
      uVar3 = (ulong)(uint)(iVar1 * 6);
      lVar11 = lVar7 * 8;
      local_64 = 0;
      local_60 = lVar11;
      local_48 = lVar7;
      do {
        local_7c = (float)(int)(local_64 | (uint)local_70) * 0.1 * 0.125 + -1.0;
        local_80 = (float)(int)(local_64 + (uint)local_70 + 1) * 0.1 * 0.125 + -1.0;
        lVar7 = 0;
        local_64 = local_64 + 1;
        local_58 = uVar3;
        do {
          uVar6 = (uint)lVar7;
          local_84 = 1.0 - (float)(int)(uVar6 | (uint)lVar11) * 0.1 * 0.125;
          local_88 = 1.0 - (float)(int)(iVar2 + 1 + uVar6) * 0.1 * 0.125;
          if (" ####    #   #### #####    #  ###### ########### ####  ####         ##       ##    #  ##  #    #     #  #   #     #         # #    ##    #        ##      # #    #   #      #   ###  #  #  #### # ###    #   ####  #####               #  #    #   #     #       #######     ###   #  #   #    #     #        ##    #   #    #   #    #   #    #    # #    ##    # #    #    #   ##   ##    ##   #     ####   ### ###### ####     #  ####  #### #      #### ###     ##        #     "
              [(int)((int)uVar3 + uVar6)] != ' ') {
            uVar3 = (long)(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start;
            uVar8 = (unsigned_short)(((uint)(uVar3 >> 0x21) & 1) + (int)(uVar3 >> 2) >> 1);
            iVar9._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            puVar4 = (this->m_ndxBuf).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (iVar9._M_current == puVar4) {
              local_8a = uVar8;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
              iVar9._M_current =
                   (this->m_ndxBuf).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar4 = (this->m_ndxBuf).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar9._M_current = uVar8;
              iVar9._M_current = iVar9._M_current + 1;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
            }
            uVar12 = uVar8 + 1;
            if (iVar9._M_current == puVar4) {
              local_8a = uVar12;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
              iVar9._M_current =
                   (this->m_ndxBuf).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar4 = (this->m_ndxBuf).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar9._M_current = uVar12;
              iVar9._M_current = iVar9._M_current + 1;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
            }
            uVar13 = uVar8 + 2;
            if (iVar9._M_current == puVar4) {
              local_8a = uVar13;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
              iVar9._M_current =
                   (this->m_ndxBuf).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar4 = (this->m_ndxBuf).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar9._M_current = uVar13;
              iVar9._M_current = iVar9._M_current + 1;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
            }
            if (iVar9._M_current == puVar4) {
              local_8a = uVar13;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
              iVar9._M_current =
                   (this->m_ndxBuf).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar4 = (this->m_ndxBuf).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar9._M_current = uVar13;
              iVar9._M_current = iVar9._M_current + 1;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
            }
            if (iVar9._M_current == puVar4) {
              local_8a = uVar12;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
              iVar9._M_current =
                   (this->m_ndxBuf).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              puVar4 = (this->m_ndxBuf).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar9._M_current = uVar12;
              iVar9._M_current = iVar9._M_current + 1;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
            }
            local_8a = uVar8 + 3;
            if (iVar9._M_current == puVar4) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar9,&local_8a);
            }
            else {
              *iVar9._M_current = local_8a;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
            this_00 = local_38;
            iVar10._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (local_38,iVar10,&local_84);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_84;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_7c);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_7c;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_88);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_88;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_7c);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_7c;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_84);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_84;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_80);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_80;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_88);
              iVar10._M_current =
                   (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pfVar5 = (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            else {
              *iVar10._M_current = local_88;
              iVar10._M_current = iVar10._M_current + 1;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current;
            }
            if (iVar10._M_current == pfVar5) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_00,iVar10,&local_80);
              uVar3 = local_58;
              lVar11 = local_60;
            }
            else {
              *iVar10._M_current = local_80;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current + 1;
              uVar3 = local_58;
              lVar11 = local_60;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
        uVar3 = uVar3 + 0x4e;
      } while (local_64 != 6);
      lVar7 = local_48 + 1;
      local_40 = (ulong)((int)local_40 + 8);
    } while (lVar7 < (int)local_50->_M_string_length);
  }
  return;
}

Assistant:

void DebugInfoRenderer::addTextToBuffer (const string& text, const int yOffset)
{
	static const char		characters[]	= "0123456789.:/";
	const int				numCharacters	= DE_LENGTH_OF_ARRAY(characters)-1; // \note -1 for null byte.
	const int				charWid			= 6;
	const int				charHei			= 6;
	static const string		charsStr		(characters);

	static const char font[numCharacters*charWid*charHei + 1]=
		" #### ""   #  "" #### ""##### ""   #  ""######"" #####""######"" #### "" #### ""      ""  ##  ""     #"
		"#    #""  ##  ""#    #""     #""  #   ""#     ""#     ""    # ""#    #""#    #""      ""  ##  ""    # "
		"#    #""   #  ""    # ""  ### "" #  # "" #### ""# ### ""   #  "" #### "" #####""      ""      ""   #  "
		"#    #""   #  ""   #  ""     #""######""     #""##   #""  #   ""#    #""     #""      ""  ##  ""  #   "
		"#    #""   #  ""  #   ""#    #""    # ""#    #""#    #"" #    ""#    #""   ## ""  ##  ""  ##  "" #    "
		" #### ""  ### ""######"" #### ""    # "" #### "" #### ""#     "" #### ""###   ""  ##  ""      ""#     ";

	for (int ndxInText = 0; ndxInText < (int)text.size(); ndxInText++)
	{
		const int ndxInCharset	= (int)charsStr.find(text[ndxInText]);
		DE_ASSERT(ndxInCharset < numCharacters);
		const int fontXStart	= ndxInCharset*charWid;

		for (int y = 0; y < charHei; y++)
		{
			float ay = -1.0f + (float)(y + 0 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			float by = -1.0f + (float)(y + 1 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			for (int x = 0; x < charWid; x++)
			{
				// \note Text is mirrored in x direction since on most(?) mobile devices the image is mirrored(?).
				float ax = 1.0f - (float)(x + 0 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);
				float bx = 1.0f - (float)(x + 1 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);

				if (font[y*numCharacters*charWid + fontXStart + x] != ' ')
				{
					const int vtxNdx = (int)m_posBuf.size()/2;

					m_ndxBuf.push_back(deUint16(vtxNdx+0));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+2));

					m_ndxBuf.push_back(deUint16(vtxNdx+2));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+3));

					m_posBuf.push_back(ax);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(ax);
					m_posBuf.push_back(by);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(by);
				}
			}
		}
	}
}